

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int *piVar2;
  int iVar3;
  ImDrawChannel *pIVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ImDrawChannel *__dest;
  long lVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  undefined4 uStack_58;
  undefined4 uStack_54;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                  ,0x59b,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar3 = (this->_Channels).Size;
  if (iVar3 < channels_count) {
    iVar16 = (this->_Channels).Capacity;
    if (iVar16 < channels_count) {
      if (iVar16 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar16 / 2 + iVar16;
      }
      if (iVar12 <= channels_count) {
        iVar12 = channels_count;
      }
      if (iVar16 < iVar12) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar12 << 5);
        pIVar4 = (this->_Channels).Data;
        if (pIVar4 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar4,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar12;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  if ((this->_Channels).Size < 1) {
LAB_0014f642:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0x5c2,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
  }
  pIVar4 = (this->_Channels).Data;
  (pIVar4->_IdxBuffer).Size = 0;
  (pIVar4->_IdxBuffer).Capacity = 0;
  (pIVar4->_IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar4->_CmdBuffer).Size = 0;
  (pIVar4->_CmdBuffer).Capacity = 0;
  (pIVar4->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar14 = 1;
    lVar13 = 0x38;
    do {
      lVar9 = (long)(this->_Channels).Size;
      if ((long)uVar14 < (long)iVar3) {
        if (lVar9 <= (long)uVar14) goto LAB_0014f642;
        pIVar4 = (this->_Channels).Data;
        iVar16 = *(int *)((long)pIVar4 + lVar13 + -0x14);
        if (iVar16 < 0) {
          uVar15 = iVar16 / 2 + iVar16;
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          pvVar10 = ImGui::MemAlloc((ulong)uVar15 * 0x38);
          pvVar5 = *(void **)((long)pIVar4 + lVar13 + -0x10);
          if (pvVar5 != (void *)0x0) {
            memcpy(pvVar10,pvVar5,(long)*(int *)((long)pIVar4 + lVar13 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar4 + lVar13 + -0x10));
          }
          *(void **)((long)pIVar4 + lVar13 + -0x10) = pvVar10;
          *(uint *)((long)pIVar4 + lVar13 + -0x14) = uVar15;
        }
        *(undefined4 *)((long)pIVar4 + lVar13 + -0x18) = 0;
        if ((long)(this->_Channels).Size <= (long)uVar14) goto LAB_0014f642;
        pIVar4 = (this->_Channels).Data;
        iVar16 = *(int *)((long)pIVar4 + lVar13 + -4);
        if (iVar16 < 0) {
          iVar16 = iVar16 / 2 + iVar16;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          pvVar10 = ImGui::MemAlloc((ulong)(uint)(iVar16 * 2));
          pvVar5 = *(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar13);
          if (pvVar5 != (void *)0x0) {
            memcpy(pvVar10,pvVar5,(long)*(int *)((long)pIVar4 + lVar13 + -8) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar13));
          }
          *(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar13) = pvVar10;
          *(int *)((long)pIVar4 + lVar13 + -4) = iVar16;
        }
        *(undefined4 *)((long)pIVar4 + lVar13 + -8) = 0;
      }
      else {
        if (lVar9 <= (long)uVar14) goto LAB_0014f642;
        pIVar4 = (this->_Channels).Data;
        puVar1 = (undefined8 *)((long)pIVar4 + lVar13 + -8);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar4 + lVar13 + -0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar14) goto LAB_0014f642;
      pIVar4 = (this->_Channels).Data;
      if (*(int *)((long)pIVar4 + lVar13 + -0x18) == 0) {
        uVar6 = *(undefined8 *)&(draw_list->_CmdHeader).ClipRect;
        uVar7 = *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.z;
        uVar8 = *(ulong *)((long)&(draw_list->_CmdHeader).TextureId + 4);
        uStack_58 = (undefined4)((ulong)*(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w >> 0x20);
        uStack_54 = (undefined4)uVar8;
        if (*(int *)((long)pIVar4 + lVar13 + -0x14) == 0) {
          pvVar10 = ImGui::MemAlloc(0x1c0);
          pvVar5 = *(void **)((long)pIVar4 + lVar13 + -0x10);
          if (pvVar5 != (void *)0x0) {
            memcpy(pvVar10,pvVar5,(long)*(int *)((long)pIVar4 + lVar13 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar4 + lVar13 + -0x10));
          }
          *(void **)((long)pIVar4 + lVar13 + -0x10) = pvVar10;
          *(undefined4 *)((long)pIVar4 + lVar13 + -0x14) = 8;
        }
        lVar9 = *(long *)((long)pIVar4 + lVar13 + -0x10);
        lVar11 = (long)*(int *)((long)pIVar4 + lVar13 + -0x18) * 0x38;
        *(undefined8 *)(lVar9 + 0x30 + lVar11) = 0;
        puVar1 = (undefined8 *)(lVar9 + 0x20 + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)(lVar9 + 0x10 + lVar11);
        *puVar1 = CONCAT44(uStack_54,uStack_58);
        puVar1[1] = uVar8 >> 0x20;
        *(undefined8 *)(lVar9 + lVar11) = uVar6;
        ((undefined8 *)(lVar9 + lVar11))[1] = uVar7;
        piVar2 = (int *)((long)pIVar4 + lVar13 + -0x18);
        *piVar2 = *piVar2 + 1;
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x20;
    } while ((uint)channels_count != uVar14);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            ImDrawCmd_HeaderCopy(&draw_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}